

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

LispPTR subr_TCP_ops(int op,LispPTR nameConn,LispPTR proto,LispPTR length,LispPTR bufaddr,
                    LispPTR maxlen)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t *NAddr;
  OneDArray *pOVar5;
  ulong uVar6;
  int *piVar7;
  hostent *phVar8;
  size_t sVar9;
  DLword *pDVar10;
  ssize_t sVar11;
  LispPTR *pLVar12;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint16_t local_3d8;
  uint16_t local_3d4;
  uint local_3d0;
  uint local_3cc;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  uint local_390;
  uint local_38c;
  uint local_370;
  uint local_36c;
  uint local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  uint local_348;
  uint local_344;
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_328;
  uint local_324;
  LispPTR local_31c;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  LispPTR local_2f8;
  LispPTR local_2f0;
  LispPTR local_2e4;
  undefined1 local_2d8 [8];
  sigset_t signals;
  size_t lf_ii_3;
  size_t lf_i_3;
  char *lf_dptr_3;
  char *lf_sptr_3;
  size_t lf_length_3;
  short *lf_sbase_3;
  char *lf_dp_3;
  char *lf_base_3;
  OneDArray *lf_arrayp_3;
  size_t lf_ii_2;
  size_t lf_i_2;
  char *lf_dptr_2;
  char *lf_sptr_2;
  size_t lf_length_2;
  short *lf_sbase_2;
  char *lf_dp_2;
  char *lf_base_2;
  OneDArray *lf_arrayp_2;
  size_t lf_ii_1;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  size_t lf_length_1;
  short *lf_sbase_1;
  char *lf_dp_1;
  char *lf_base_1;
  OneDArray *lf_arrayp_1;
  int *fixpp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp;
  int result;
  DLword *buffer;
  int protocol;
  int addr_class;
  sockaddr_in farend;
  servent *service;
  hostent *host;
  sockaddr_in addr;
  char servstring [50];
  short local_a8 [4];
  char namestring [100];
  socklen_t local_38;
  uint32_t local_34;
  uint ures;
  int res;
  int buflen;
  int len;
  int sock;
  LispPTR maxlen_local;
  LispPTR bufaddr_local;
  LispPTR length_local;
  LispPTR proto_local;
  LispPTR nameConn_local;
  int op_local;
  
  proto_local._0_2_ = (undefined2)op;
  len = maxlen;
  sock = bufaddr;
  maxlen_local = length;
  bufaddr_local = proto;
  length_local = nameConn;
  proto_local = op;
  switch((undefined2)proto_local) {
  case 0:
    pLVar12 = NativeAligned4FromLAddr(nameConn);
    if ((int)pLVar12[2] < 100) {
      local_2e4 = pLVar12[2];
    }
    else {
      local_2e4 = 100;
    }
    piVar7 = (int *)(long)(int)local_2e4;
    if (*(char *)((long)pLVar12 + 6) == 'C') {
      pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
      lf_i = (size_t)local_a8;
      lf_dptr = (char *)((long)pDVar10 + (long)(int)(uint)(ushort)pLVar12[1]);
      for (lf_ii = 0; lf_ii < piVar7; lf_ii = lf_ii + 1) {
        *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
        lf_i = lf_i + 1;
        lf_dptr = lf_dptr + 1;
      }
      *(undefined1 *)((long)local_a8 + (long)piVar7) = 0;
    }
    else if (*(char *)((long)pLVar12 + 6) == 'D') {
      pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
      lf_length = (size_t)(pDVar10 + (int)(uint)(ushort)pLVar12[1]);
      lf_sbase = local_a8;
      for (fixpp = (int *)0x0; fixpp < piVar7; fixpp = (int *)((long)fixpp + 1)) {
        *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
        lf_length = lf_length + 2;
        lf_sbase = (short *)((long)lf_sbase + 1);
      }
      *(undefined1 *)lf_sbase = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    phVar8 = gethostbyname((char *)local_a8);
    if (phVar8 == (hostent *)0x0) {
      nameConn_local = 0;
    }
    else {
      local_34 = ntohl(*(uint32_t *)*phVar8->h_addr_list);
      if (local_34 >> 0x10 == 0xffff) {
        nameConn_local = local_34 & 0xffff | 0xf0000;
      }
      else if (local_34 >> 0x10 == 0) {
        nameConn_local = local_34 | 0xe0000;
      }
      else {
        NAddr = (uint32_t *)createcell68k(2);
        *NAddr = local_34;
        nameConn_local = LAddrFromNative(NAddr);
      }
    }
    break;
  case 1:
    pLVar12 = NativeAligned4FromLAddr(nameConn);
    if ((int)pLVar12[2] < 100) {
      local_2f0 = pLVar12[2];
    }
    else {
      local_2f0 = 100;
    }
    pOVar5 = (OneDArray *)(long)(int)local_2f0;
    if (*(char *)((long)pLVar12 + 6) == 'C') {
      pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
      lf_i_1 = (size_t)local_a8;
      lf_dptr_1 = (char *)((long)pDVar10 + (long)(int)(uint)(ushort)pLVar12[1]);
      for (lf_ii_1 = 0; lf_ii_1 < pOVar5; lf_ii_1 = lf_ii_1 + 1) {
        *(undefined1 *)lf_i_1 = *(undefined1 *)((ulong)lf_dptr_1 ^ 3);
        lf_i_1 = lf_i_1 + 1;
        lf_dptr_1 = lf_dptr_1 + 1;
      }
      *(undefined1 *)((long)local_a8 + (long)pOVar5) = 0;
    }
    else if (*(char *)((long)pLVar12 + 6) == 'D') {
      pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
      lf_length_1 = (size_t)(pDVar10 + (int)(uint)(ushort)pLVar12[1]);
      lf_sbase_1 = local_a8;
      for (lf_arrayp_2 = (OneDArray *)0x0; lf_arrayp_2 < pOVar5;
          lf_arrayp_2 = (OneDArray *)&lf_arrayp_2->field_0x1) {
        *(char *)lf_sbase_1 = (char)*(undefined2 *)(lf_length_1 ^ 2);
        lf_length_1 = lf_length_1 + 2;
        lf_sbase_1 = (short *)((long)lf_sbase_1 + 1);
      }
      *(undefined1 *)lf_sbase_1 = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    pLVar12 = NativeAligned4FromLAddr(bufaddr_local);
    if ((int)pLVar12[2] < 0x32) {
      local_2f8 = pLVar12[2];
    }
    else {
      local_2f8 = 0x32;
    }
    pOVar5 = (OneDArray *)(long)(int)local_2f8;
    if (*(char *)((long)pLVar12 + 6) == 'C') {
      pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
      lf_i_2 = (size_t)addr.sin_zero;
      lf_dptr_2 = (char *)((long)pDVar10 + (long)(int)(uint)(ushort)pLVar12[1]);
      for (lf_ii_2 = 0; lf_ii_2 < pOVar5; lf_ii_2 = lf_ii_2 + 1) {
        *(undefined1 *)lf_i_2 = *(undefined1 *)((ulong)lf_dptr_2 ^ 3);
        lf_i_2 = lf_i_2 + 1;
        lf_dptr_2 = lf_dptr_2 + 1;
      }
      addr.sin_zero[(long)pOVar5] = '\0';
    }
    else if (*(char *)((long)pLVar12 + 6) == 'D') {
      pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
      lf_length_2 = (size_t)(pDVar10 + (int)(uint)(ushort)pLVar12[1]);
      lf_sbase_2 = (short *)addr.sin_zero;
      for (lf_arrayp_3 = (OneDArray *)0x0; lf_arrayp_3 < pOVar5;
          lf_arrayp_3 = (OneDArray *)&lf_arrayp_3->field_0x1) {
        *(char *)lf_sbase_2 = (char)*(undefined2 *)(lf_length_2 ^ 2);
        lf_length_2 = lf_length_2 + 2;
        lf_sbase_2 = (short *)((long)lf_sbase_2 + 1);
      }
      *(undefined1 *)lf_sbase_2 = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    farend.sin_zero = (uchar  [8])getservbyname((char *)local_a8,(char *)addr.sin_zero);
    if (farend.sin_zero == (uchar  [8])0x0) {
      nameConn_local = 0;
    }
    else {
      uVar1 = ntohs((uint16_t)*(int *)((long)farend.sin_zero + 0x10));
      nameConn_local = GetSmallp((ulong)uVar1);
    }
    break;
  case 2:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_300 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_304 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_304 = *pLVar12;
      }
      local_300 = local_304;
    }
    if ((bufaddr_local & 0xfff0000) == 0xe0000) {
      local_308 = bufaddr_local & 0xffff;
    }
    else {
      if ((bufaddr_local & 0xfff0000) == 0xf0000) {
        local_30c = bufaddr_local | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(bufaddr_local);
        local_30c = *pLVar12;
      }
      local_308 = local_30c;
    }
    iVar2 = socket(local_300,local_308,0);
    uVar4 = fcntl(iVar2,3,0);
    fcntl(iVar2,4,(ulong)(uVar4 | 0x2800));
    uVar4 = getpid();
    fcntl(iVar2,8,(ulong)uVar4);
    nameConn_local = GetSmallp((long)iVar2);
    break;
  case 3:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_354 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_358 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_358 = *pLVar12;
      }
      local_354 = local_358;
    }
    buflen = local_354;
    LispIOFds.__fds_bits[(int)local_354 / 0x40] =
         (1L << ((byte)((long)(int)local_354 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
         LispIOFds.__fds_bits[(int)local_354 / 0x40];
    LispReadFds.__fds_bits[(int)local_354 / 0x40] =
         (1L << ((byte)((long)(int)local_354 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
         LispReadFds.__fds_bits[(int)local_354 / 0x40];
    shutdown(local_354,2);
    close(buflen);
    nameConn_local = 0x4c;
    break;
  case 4:
    memset(&protocol,0,0x10);
    if ((length_local & 0xfff0000) == 0xe0000) {
      local_34 = length_local & 0xffff;
LAB_0013e928:
      addr_class = htonl(local_34);
    }
    else {
      if ((length_local & 0xfff0000) == 0xf0000) {
        local_34 = length_local | 0xffff0000;
        goto LAB_0013e928;
      }
      if ((*(ushort *)((ulong)(MDStypetbl + (length_local >> 9)) ^ 2) & 0x7ff) == 2) {
        pLVar12 = NativeAligned4FromLAddr(length_local);
        local_34 = *pLVar12;
        goto LAB_0013e928;
      }
      pLVar12 = NativeAligned4FromLAddr(length_local);
      if ((int)pLVar12[2] < 100) {
        local_31c = pLVar12[2];
      }
      else {
        local_31c = 100;
      }
      uVar6 = (ulong)(int)local_31c;
      if (*(char *)((long)pLVar12 + 6) == 'C') {
        pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
        lf_i_3 = (size_t)local_a8;
        lf_dptr_3 = (char *)((long)pDVar10 + (long)(int)(uint)(ushort)pLVar12[1]);
        for (lf_ii_3 = 0; lf_ii_3 < uVar6; lf_ii_3 = lf_ii_3 + 1) {
          *(undefined1 *)lf_i_3 = *(undefined1 *)((ulong)lf_dptr_3 ^ 3);
          lf_i_3 = lf_i_3 + 1;
          lf_dptr_3 = lf_dptr_3 + 1;
        }
        *(undefined1 *)((long)local_a8 + uVar6) = 0;
      }
      else if (*(char *)((long)pLVar12 + 6) == 'D') {
        pDVar10 = NativeAligned2FromLAddr(*pLVar12 & 0xfffffff);
        lf_length_3 = (size_t)(pDVar10 + (int)(uint)(ushort)pLVar12[1]);
        lf_sbase_3 = local_a8;
        for (signals.__val[0xf] = 0; signals.__val[0xf] < uVar6;
            signals.__val[0xf] = signals.__val[0xf] + 1) {
          *(char *)lf_sbase_3 = (char)*(undefined2 *)(lf_length_3 ^ 2);
          lf_length_3 = lf_length_3 + 2;
          lf_sbase_3 = (short *)((long)lf_sbase_3 + 1);
        }
        *(undefined1 *)lf_sbase_3 = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      phVar8 = gethostbyname((char *)local_a8);
      if (phVar8 == (hostent *)0x0) {
        return 0;
      }
      memcpy(&addr_class,*phVar8->h_addr_list,(long)phVar8->h_length);
    }
    if ((bufaddr_local & 0xfff0000) == 0xe0000) {
      local_324 = bufaddr_local & 0xffff;
    }
    else {
      if ((bufaddr_local & 0xfff0000) == 0xf0000) {
        local_328 = bufaddr_local | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(bufaddr_local);
        local_328 = *pLVar12;
      }
      local_324 = local_328;
    }
    buflen = local_324;
    iVar2 = socket(2,1,0);
    protocol._0_2_ = 2;
    protocol._2_2_ = htons((uint16_t)buflen);
    iVar3 = connect(iVar2,(sockaddr *)&protocol,0x10);
    if (iVar3 < 0) {
      perror("TCP connect");
      nameConn_local = 0;
    }
    else {
      uVar4 = fcntl(iVar2,3,0);
      fcntl(iVar2,4,(ulong)(uVar4 | 0x800));
      uVar4 = getpid();
      fcntl(iVar2,8,(ulong)uVar4);
      nameConn_local = GetSmallp((long)iVar2);
    }
    break;
  case 5:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_334 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_338 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_338 = *pLVar12;
      }
      local_334 = local_338;
    }
    buflen = local_334;
    pDVar10 = NativeAligned2FromLAddr(bufaddr_local);
    if ((maxlen_local & 0xfff0000) == 0xe0000) {
      local_33c = maxlen_local & 0xffff;
    }
    else {
      if ((maxlen_local & 0xfff0000) == 0xf0000) {
        local_340 = maxlen_local | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(maxlen_local);
        local_340 = *pLVar12;
      }
      local_33c = local_340;
    }
    res = local_33c;
    word_swap_page(pDVar10,(int)(local_33c + 3) >> 2);
    sVar11 = send(buflen,pDVar10,(long)res,0);
    word_swap_page(pDVar10,res + 3 >> 2);
    if ((int)sVar11 < 0) {
      perror("TCP send");
      nameConn_local = 0;
    }
    else {
      nameConn_local = GetSmallp((long)(int)sVar11);
    }
    break;
  case 6:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_344 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_348 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_348 = *pLVar12;
      }
      local_344 = local_348;
    }
    buflen = local_344;
    pDVar10 = NativeAligned2FromLAddr(bufaddr_local);
    if ((maxlen_local & 0xfff0000) == 0xe0000) {
      local_34c = maxlen_local & 0xffff;
    }
    else {
      if ((maxlen_local & 0xfff0000) == 0xf0000) {
        local_350 = maxlen_local | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(maxlen_local);
        local_350 = *pLVar12;
      }
      local_34c = local_350;
    }
    res = local_34c;
    sVar11 = read(buflen,pDVar10,(long)(int)local_34c);
    iVar2 = (int)sVar11;
    if (iVar2 < 0) {
      piVar7 = __errno_location();
      if (*piVar7 == 0xb) {
        nameConn_local = 0x4c;
      }
      else {
        perror("TCP read");
        piVar7 = __errno_location();
        *Lisp_errno = *piVar7;
        nameConn_local = 0;
      }
    }
    else {
      word_swap_page(pDVar10,iVar2 + 3 >> 2);
      nameConn_local = GetSmallp((long)iVar2);
    }
    break;
  case 7:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_36c = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_370 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_370 = *pLVar12;
      }
      local_36c = local_370;
    }
    buflen = local_36c;
    iVar2 = socket(2,1,0);
    protocol._0_2_ = 2;
    protocol._2_2_ = htons((uint16_t)buflen);
    addr_class = 0;
    iVar3 = bind(iVar2,(sockaddr *)&protocol,0x10);
    if (iVar3 < 0) {
      perror("TCP bind");
      close(iVar2);
      nameConn_local = 0;
    }
    else {
      sigemptyset((sigset_t *)local_2d8);
      sigaddset((sigset_t *)local_2d8,0x1d);
      sigprocmask(0,(sigset_t *)local_2d8,(sigset_t *)0x0);
      uVar4 = fcntl(iVar2,3,0);
      fcntl(iVar2,4,(ulong)(uVar4 | 0x2800));
      uVar4 = getpid();
      fcntl(iVar2,8,(ulong)uVar4);
      iVar3 = listen(iVar2,5);
      if (iVar3 == -1) {
        perror("TCP Listen");
        close(iVar2);
        sigprocmask(1,(sigset_t *)local_2d8,(sigset_t *)0x0);
        nameConn_local = 0;
      }
      else {
        sigprocmask(1,(sigset_t *)local_2d8,(sigset_t *)0x0);
        LispIOFds.__fds_bits[iVar2 / 0x40] =
             1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | LispIOFds.__fds_bits[iVar2 / 0x40];
        LispReadFds.__fds_bits[iVar2 / 0x40] =
             1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | LispReadFds.__fds_bits[iVar2 / 0x40];
        nameConn_local = GetSmallp((long)iVar2);
      }
    }
    break;
  case 8:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_38c = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_390 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_390 = *pLVar12;
      }
      local_38c = local_390;
    }
    buflen = local_38c;
    iVar2 = accept(local_38c,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar2 < 0) {
      piVar7 = __errno_location();
      if (*piVar7 != 0xb) {
        perror("TCP Accept");
      }
      nameConn_local = 0;
    }
    else {
      uVar4 = fcntl(iVar2,3,0);
      fcntl(iVar2,4,(ulong)(uVar4 | 0x800));
      uVar4 = getpid();
      fcntl(iVar2,8,(ulong)uVar4);
      nameConn_local = GetSmallp((long)iVar2);
    }
    break;
  default:
    nameConn_local = 0;
    break;
  case 0x40:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_39c = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_3a0 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_3a0 = *pLVar12;
      }
      local_39c = local_3a0;
    }
    buflen = local_39c;
    pDVar10 = NativeAligned2FromLAddr(bufaddr_local);
    local_38 = 0x10;
    getpeername(buflen,(sockaddr *)&host,&local_38);
    phVar8 = gethostbyaddr(&host,local_38,2);
    strcpy((char *)pDVar10,phVar8->h_name);
    sVar9 = strlen(phVar8->h_name);
    nameConn_local = GetSmallp(sVar9);
    break;
  case 0x42:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_3a4 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_3a8 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_3a8 = *pLVar12;
      }
      local_3a4 = local_3a8;
    }
    buflen = local_3a4;
    pDVar10 = NativeAligned2FromLAddr(bufaddr_local);
    local_38 = 0x10;
    host._4_4_ = htonl(buflen);
    phVar8 = gethostbyaddr(&host,local_38,0);
    if (phVar8 == (hostent *)0x0) {
      nameConn_local = GetSmallp(0);
    }
    else {
      strcpy((char *)pDVar10,phVar8->h_name);
      sVar9 = strlen(phVar8->h_name);
      nameConn_local = GetSmallp(sVar9);
    }
    break;
  case 0x80:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_3ac = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_3b0 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_3b0 = *pLVar12;
      }
      local_3ac = local_3b0;
    }
    buflen = local_3ac;
    iVar2 = socket(2,2,0);
    protocol._0_2_ = 2;
    protocol._2_2_ = htons((uint16_t)buflen);
    addr_class = 0;
    iVar3 = bind(iVar2,(sockaddr *)&protocol,0x10);
    if (iVar3 < 0) {
      perror("UDP bind");
      close(iVar2);
      nameConn_local = 0;
    }
    else {
      uVar4 = fcntl(iVar2,3,0);
      fcntl(iVar2,4,(ulong)(uVar4 | 0x2800));
      uVar4 = getpid();
      fcntl(iVar2,8,(ulong)uVar4);
      LispIOFds.__fds_bits[iVar2 / 0x40] =
           1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | LispIOFds.__fds_bits[iVar2 / 0x40];
      LispReadFds.__fds_bits[iVar2 / 0x40] =
           1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | LispReadFds.__fds_bits[iVar2 / 0x40];
      nameConn_local = GetSmallp((long)iVar2);
    }
    break;
  case 0x82:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_3cc = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_3d0 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_3d0 = *pLVar12;
      }
      local_3cc = local_3d0;
    }
    buflen = local_3cc;
    protocol._0_2_ = 2;
    local_3d4 = (uint16_t)maxlen_local;
    if ((maxlen_local & 0xfff0000) != 0xe0000) {
      local_3d8 = local_3d4;
      if ((maxlen_local & 0xfff0000) != 0xf0000) {
        pLVar12 = NativeAligned4FromLAddr(maxlen_local);
        local_3d8 = (uint16_t)*pLVar12;
      }
      local_3d4 = local_3d8;
    }
    protocol._2_2_ = htons(local_3d4);
    if ((bufaddr_local & 0xfff0000) == 0xe0000) {
      local_3dc = bufaddr_local & 0xffff;
    }
    else {
      if ((bufaddr_local & 0xfff0000) == 0xf0000) {
        local_3e0 = bufaddr_local | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(bufaddr_local);
        local_3e0 = *pLVar12;
      }
      local_3dc = local_3e0;
    }
    addr_class = htonl(local_3dc);
    pDVar10 = NativeAligned2FromLAddr(sock);
    if ((len & 0xfff0000U) == 0xe0000) {
      local_3e4 = len & 0xffff;
    }
    else {
      if ((len & 0xfff0000U) == 0xf0000) {
        local_3e8 = len | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(len);
        local_3e8 = *pLVar12;
      }
      local_3e4 = local_3e8;
    }
    ures = local_3e4;
    word_swap_page(pDVar10,(int)(local_3e4 + 3) >> 2);
    sVar11 = sendto(buflen,pDVar10,(long)(int)ures,0,(sockaddr *)&protocol,0x10);
    word_swap_page(pDVar10,(int)(ures + 3) >> 2);
    if ((int)sVar11 < 0) {
      perror("UDP Send");
      printf(" fd = %d, addr = 0x%x.\n",(ulong)(uint)buflen,(ulong)(uint)addr_class);
      nameConn_local = 0;
    }
    else {
      nameConn_local = GetSmallp((long)(int)sVar11);
    }
    break;
  case 0x83:
    if ((nameConn & 0xfff0000) == 0xe0000) {
      local_3ec = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        local_3f0 = nameConn | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(nameConn);
        local_3f0 = *pLVar12;
      }
      local_3ec = local_3f0;
    }
    buflen = local_3ec;
    pDVar10 = NativeAligned2FromLAddr(bufaddr_local);
    if ((maxlen_local & 0xfff0000) == 0xe0000) {
      local_3f4 = maxlen_local & 0xffff;
    }
    else {
      if ((maxlen_local & 0xfff0000) == 0xf0000) {
        local_3f8 = maxlen_local | 0xffff0000;
      }
      else {
        pLVar12 = NativeAligned4FromLAddr(maxlen_local);
        local_3f8 = *pLVar12;
      }
      local_3f4 = local_3f8;
    }
    ures = local_3f4;
    local_38 = 0x10;
    sVar11 = recvfrom(buflen,pDVar10,(long)(int)local_3f4,0,(sockaddr *)&protocol,&local_38);
    iVar2 = (int)sVar11;
    if (iVar2 < 0) {
      perror("UDP Recv");
      nameConn_local = 0;
    }
    else {
      pLVar12 = NativeAligned4FromLAddr(sock);
      *pLVar12 = addr_class;
      pLVar12 = NativeAligned4FromLAddr(len);
      *pLVar12 = (uint)protocol._2_2_;
      word_swap_page(pDVar10,iVar2 + 3 >> 2);
      nameConn_local = GetSmallp((long)iVar2);
    }
  }
  return nameConn_local;
}

Assistant:

LispPTR subr_TCP_ops(int op, LispPTR nameConn, LispPTR proto, LispPTR length, LispPTR bufaddr, LispPTR maxlen)
{
#ifndef DOS
  int sock, len, buflen, res;
  unsigned ures;
  char namestring[100];
  char servstring[50];
  struct sockaddr_in addr;
  struct hostent *host;
  struct servent *service;
  struct sockaddr_in farend;
  int addr_class, protocol;
  DLword *buffer;
  int result;

  switch (op & 0xFFFF) {
    case TCPhostlookup:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      res = ntohl(*(in_addr_t *)host->h_addr);
      N_ARITH_SWITCH(res);
      break;

    case TCPservicelookup:
      LispStringToCString(nameConn, namestring, 100);
      LispStringToCString(proto, servstring, 50);
      service = getservbyname(namestring, servstring);
      if (!service) return (NIL);
      return (GetSmallp(ntohs(service->s_port)));

    case TCPsocket:
      addr_class = LispNumToCInt(nameConn);
      protocol = LispNumToCInt(proto);
      result = socket(addr_class, protocol, 0);
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));
    case TCPconnect: /* args: hostname or (fixp)address, socket# */
      memset(&farend, 0, sizeof farend);
      N_GETNUMBER(nameConn, res, string_host);
      farend.sin_addr.s_addr = htonl(res);
      goto host_ok;
    string_host:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      memcpy((char *)&farend.sin_addr, (char *)host->h_addr, host->h_length);
    host_ok:
      sock = LispNumToCInt(proto);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      if (connect(result, (struct sockaddr *)&farend, sizeof farend) < 0) {
        perror("TCP connect");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));

    case TCPsend: /* args: conn, buffer, len */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      DBPRINT(("sock: %d, len %d.\n", sock, len));

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      result = send(sock, buffer, len, 0);

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      if (result < 0) {
        perror("TCP send");
        return (NIL);
      }
      return (GetSmallp(result));

    case TCPrecv: /* args: conn, buffer, maxlen */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      result = read(sock, buffer, len);
      if (result < 0) {
        if (errno == EWOULDBLOCK) return (ATOM_T);
        perror("TCP read");
        *Lisp_errno = errno;
        return (NIL);
      }
#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    case TCPclose:
      sock = LispNumToCInt(nameConn);
      FD_CLR(sock, &LispIOFds);
      FD_CLR(sock, &LispReadFds);
      shutdown(sock, 2);
      close(sock);
      return (ATOM_T);

    case TCPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("TCP bind");
        close(result);
        return (NIL);
      }
      { /* Do this without taking IO interrupts */
        sigset_t signals;

        sigemptyset(&signals);
#ifndef MAIKO_OS_HAIKU
        sigaddset(&signals, SIGIO);
#endif
        sigprocmask(SIG_BLOCK, &signals, NULL);

#ifndef MAIKO_OS_HAIKU
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif

#ifdef F_SETOWN
	fcntl(result, F_SETOWN, getpid());
#endif
        if (listen(result, 5) == -1) {
          perror("TCP Listen");
          close(result);
          sigprocmask(SIG_UNBLOCK, &signals, NULL);
          return (NIL);
        }
        sigprocmask(SIG_UNBLOCK, &signals, NULL);
      }
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case TCPAccept: /* Socket we're listening on */
      sock = LispNumToCInt(nameConn);
      result = accept(sock, NULL, 0);
      if (result < 0) {
        if (errno != EWOULDBLOCK) perror("TCP Accept");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      return (GetSmallp(result));

    case INETpeername: /* socket#, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      getpeername(sock, (struct sockaddr *)&addr, &ures);
      host = gethostbyaddr((const char *)&addr, ures, AF_INET);
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case INETgetname: /* host addr, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      addr.sin_addr.s_addr = htonl(sock);
      host = gethostbyaddr((const char *)&addr, ures, 0);
      if (!host) return (GetSmallp(0));
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case UDPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_DGRAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("UDP bind");
        close(result);
        return (NIL);
      }
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case UDPSendto: /* fd-socket# addr remote-socket buffer len*/
      sock = LispNumToCInt(nameConn);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(LispNumToCInt(length));
      farend.sin_addr.s_addr = htonl(LispNumToCInt(proto));
      buffer = NativeAligned2FromLAddr(bufaddr);
      buflen = LispNumToCInt(maxlen);

      DBPRINT(("UDP send:  socket = %d, remote-port = %d.\n", sock, farend.sin_port));
      DBPRINT(("           remote-addr = 0x%x, buflen = %d.\n", farend.sin_addr.s_addr, buflen));

#ifdef BYTESWAP
      word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      result = sendto(sock, buffer, buflen, 0, (struct sockaddr *)&farend, sizeof farend);
#ifdef BYTESWAP
        word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      if (result < 0) {
        perror("UDP Send");
        printf(" fd = %d, addr = 0x%x.\n", sock, farend.sin_addr.s_addr);
        return (NIL);
      }
      return (GetSmallp(result));

    case UDPRecvfrom: /* fd-socket# buffer len addr-cell port-cell*/
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      buflen = LispNumToCInt(length);
      ures = sizeof farend;
      if ((result = recvfrom(sock, buffer, buflen, 0, (struct sockaddr *)&farend, &ures)) < 0) {
        perror("UDP Recv");
        return (NIL);
      }

      DBPRINT(("UDP recv:  socket = %d, len = %d.\n", sock, result));
      DBPRINT(("           remote-addr = 0x%x, remote-port = %d.\n", ntohl(farend.sin_addr.s_addr),
               ntohs(farend.sin_port)));
      DBPRINT(("           bufsize = %d, addrcell = 0x%x, portcell = 0x%x.\n", buflen, bufaddr,
               maxlen));

      /* XXX NBriggs: 12 Aug 2020 -- WHAT IS GOING ON HERE? */
      *((int *)NativeAligned4FromLAddr(bufaddr)) = (int)farend.sin_addr.s_addr;
      *((int *)NativeAligned4FromLAddr(maxlen)) = (int)farend.sin_port;

#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    default: return (NIL);
  }
#endif /* DOS */
}